

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.cc
# Opt level: O2

void __thiscall
re2c::DFA::DFA(DFA *this,dfa_t *dfa,vector<unsigned_long,_std::allocator<unsigned_long>_> *fill,
              Skeleton *skel,charset_t *charset,string *n,string *c,uint32_t l)

{
  size_t n_00;
  dfa_state_t *pdVar1;
  pointer puVar2;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  State *pSVar6;
  Span *pSVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  State *pSVar11;
  uint uVar12;
  size_t i;
  State **local_78;
  
  (this->accepts).elems.
  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->accepts).elems.
  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->accepts).elems.
  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->skeleton = skel;
  std::__cxx11::string::string((string *)&this->name,(string *)n);
  std::__cxx11::string::string((string *)&this->cond,(string *)c);
  this->line = l;
  this->lbChar = 0;
  this->ubChar = (charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1];
  *(undefined8 *)&this->nStates = 0;
  *(undefined8 *)((long)&this->head + 4) = 0;
  *(undefined8 *)((long)&this->max_fill + 3) = 0;
  n_00 = dfa->nchars;
  uVar4 = (long)(dfa->states).
                super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(dfa->states).
                super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)uVar4 >> 3;
  pvVar5 = operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar4);
  local_78 = &this->head;
  for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
    pSVar6 = (State *)operator_new(0x58);
    State::State(pSVar6);
    *(State **)((long)pvVar5 + uVar4 * 8) = pSVar6;
  }
  uVar4 = 0;
  do {
    if (uVar4 == uVar9) {
      *local_78 = (State *)0x0;
      operator_delete__(pvVar5);
      return;
    }
    pdVar1 = (dfa->states).
             super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
    pSVar6 = *(State **)((long)pvVar5 + uVar4 * 8);
    this->nStates = this->nStates + 1;
    *local_78 = pSVar6;
    pSVar6->isPreCtxt = pdVar1->ctx;
    pSVar6->rule = pdVar1->rule;
    pSVar6->fill = (fill->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_start[uVar4];
    pSVar7 = allocate<re2c::Span>(n_00);
    local_78 = &pSVar6->next;
    (pSVar6->go).span = pSVar7;
    puVar2 = (charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar12 = 0;
    while( true ) {
      if (n_00 <= uVar12) break;
      sVar3 = pdVar1->arcs[uVar12];
      do {
        uVar12 = uVar12 + 1;
        uVar10 = (ulong)uVar12;
        if (n_00 <= uVar10) break;
      } while (pdVar1->arcs[uVar10] == sVar3);
      if (sVar3 == 0xffffffffffffffff) {
        pSVar11 = (State *)0x0;
      }
      else {
        pSVar11 = *(State **)((long)pvVar5 + sVar3 * 8);
      }
      pSVar7[uVar8].to = pSVar11;
      pSVar7[uVar8].ub = puVar2[uVar10];
      uVar8 = (ulong)((uint32_t)uVar8 + 1);
    }
    (pSVar6->go).nSpans = (uint32_t)uVar8;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

DFA::DFA
	( const dfa_t &dfa
	, const std::vector<size_t> &fill
	, Skeleton *skel
	, const charset_t &charset
	, const std::string &n
	, const std::string &c
	, uint32_t l
	)
	: accepts ()
	, skeleton (skel)
	, name (n)
	, cond (c)
	, line (l)
	, lbChar(0)
	, ubChar(charset.back())
	, nStates(0)
	, head(NULL)

	// statistics
	, max_fill (0)
	, need_backup (false)
	, need_backupctx (false)
	, need_accept (false)
{
	const size_t nstates = dfa.states.size();
	const size_t nchars = dfa.nchars;

	State **i2s = new State*[nstates];
	for (size_t i = 0; i < nstates; ++i)
	{
		i2s[i] = new State;
	}

	State **p = &head;
	for (size_t i = 0; i < nstates; ++i)
	{
		dfa_state_t *t = dfa.states[i];
		State *s = i2s[i];

		++nStates;
		*p = s;
		p = &s->next;

		s->isPreCtxt = t->ctx;
		s->rule = t->rule;
		s->fill = fill[i];
		s->go.span = allocate<Span>(nchars);
		uint32_t j = 0;
		for (uint32_t c = 0; c < nchars; ++j)
		{
			const size_t to = t->arcs[c];
			for (;++c < nchars && t->arcs[c] == to;);
			s->go.span[j].to = to == dfa_t::NIL ? NULL : i2s[to];
			s->go.span[j].ub = charset[c];
		}
		s->go.nSpans = j;
	}
	*p = NULL;

	delete[] i2s;
}